

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprPopulatePoslistsCb
              (void *pCtx,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *__s;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = 0x8000;
  if (nToken < 0x8000) {
    iVar8 = nToken;
  }
  if ((tflags & 1U) == 0) {
    *(long *)((long)pCtx + 0x10) = *(long *)((long)pCtx + 0x10) + 1;
  }
  lVar1 = *pCtx;
  lVar7 = 0;
  do {
    if (*(int *)(lVar1 + 0x1c) <= lVar7) {
      return 0;
    }
    lVar2 = *(long *)((long)pCtx + 8);
    if (*(int *)(lVar2 + 8 + lVar7 * 0x10) != 0) {
      lVar3 = *(long *)(*(long *)(lVar1 + 0x20) + lVar7 * 8);
      for (pcVar6 = (char *)(lVar3 + 0x20); pcVar6 != (char *)0x0;
          pcVar6 = *(char **)(pcVar6 + 0x18)) {
        __s = *(char **)(pcVar6 + 8);
        sVar5 = strlen(__s);
        iVar4 = (int)sVar5;
        if (((iVar8 == iVar4) || ((iVar4 < iVar8 && (*pcVar6 != '\0')))) &&
           (iVar4 = bcmp(__s,pToken,(long)iVar4), iVar4 == 0)) {
          iVar4 = sqlite3Fts5PoslistWriterAppend
                            ((Fts5Buffer *)(lVar3 + 8),(Fts5PoslistWriter *)(lVar2 + lVar7 * 0x10),
                             *(i64 *)((long)pCtx + 0x10));
          if (iVar4 != 0) {
            return iVar4;
          }
          break;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static int fts5ExprPopulatePoslistsCb(
  void *pCtx,                /* Copy of 2nd argument to xTokenize() */
  int tflags,                /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,        /* Pointer to buffer containing token */
  int nToken,                /* Size of token in bytes */
  int iUnused1,              /* Byte offset of token within input text */
  int iUnused2               /* Byte offset of end of token within input text */
){
  Fts5ExprCtx *p = (Fts5ExprCtx*)pCtx;
  Fts5Expr *pExpr = p->pExpr;
  int i;

  UNUSED_PARAM2(iUnused1, iUnused2);

  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ) p->iOff++;
  for(i=0; i<pExpr->nPhrase; i++){
    Fts5ExprTerm *pTerm;
    if( p->aPopulator[i].bOk==0 ) continue;
    for(pTerm=&pExpr->apExprPhrase[i]->aTerm[0]; pTerm; pTerm=pTerm->pSynonym){
      int nTerm = (int)strlen(pTerm->zTerm);
      if( (nTerm==nToken || (nTerm<nToken && pTerm->bPrefix))
       && memcmp(pTerm->zTerm, pToken, nTerm)==0
      ){
        int rc = sqlite3Fts5PoslistWriterAppend(
            &pExpr->apExprPhrase[i]->poslist, &p->aPopulator[i].writer, p->iOff
        );
        if( rc ) return rc;
        break;
      }
    }
  }
  return SQLITE_OK;
}